

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

bool __thiscall QHttp2Connection::streamWasResetLocally(QHttp2Connection *this,quint32 streamID)

{
  long lVar1;
  quint32 *pqVar2;
  long in_RCX;
  long lVar3;
  
  if (*(long *)(this + 0x1e8) != 0) {
    lVar3 = -4;
    do {
      lVar1 = *(long *)(this + 0x1e8) * -4 + lVar3;
      if (lVar1 == -4) goto LAB_001ee2a3;
      in_RCX = lVar3 + 4;
      pqVar2 = (quint32 *)(*(long *)(this + 0x1e0) + 4 + lVar3);
      lVar3 = in_RCX;
    } while (*pqVar2 != streamID);
    in_RCX = in_RCX >> 2;
LAB_001ee2a3:
    if (lVar1 != -4) goto LAB_001ee2b0;
  }
  in_RCX = -1;
LAB_001ee2b0:
  return in_RCX != -1;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }